

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlNode * __thiscall despot::util::tinyxml::TiXmlComment::Clone(TiXmlComment *this)

{
  TiXmlComment *clone;
  TiXmlComment *this_local;
  
  this_local = (TiXmlComment *)operator_new(0x50);
  TiXmlComment(this_local);
  if (this_local == (TiXmlComment *)0x0) {
    this_local = (TiXmlComment *)0x0;
  }
  else {
    CopyTo(this,this_local);
  }
  return &this_local->super_TiXmlNode;
}

Assistant:

TiXmlNode* TiXmlComment::Clone() const {
	TiXmlComment* clone = new TiXmlComment();

	if (!clone)
		return 0;

	CopyTo(clone);
	return clone;
}